

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_rc_Buf.h
# Opt level: O1

void __thiscall
axl::rc::BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError>::move
          (BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *this,
          BufRef<axl::err::ErrorHdr,_axl::err::SizeOfError> *src)

{
  int32_t *piVar1;
  BufHdr *pBVar2;
  FreeFunc *pFVar3;
  
  pBVar2 = this->m_hdr;
  if (pBVar2 != (BufHdr *)0x0) {
    LOCK();
    piVar1 = &(pBVar2->super_RefCount).m_refCount;
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      (**(pBVar2->super_RefCount)._vptr_RefCount)(pBVar2);
      LOCK();
      piVar1 = &(pBVar2->super_RefCount).m_weakRefCount;
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if ((*piVar1 == 0) &&
         (pFVar3 = (pBVar2->super_RefCount).m_freeFunc, pFVar3 != (FreeFunc *)0x0)) {
        (*pFVar3)(pBVar2);
      }
    }
  }
  pBVar2 = src->m_hdr;
  this->m_p = src->m_p;
  this->m_hdr = pBVar2;
  this->m_size = src->m_size;
  src->m_p = (ErrorHdr *)0x0;
  src->m_hdr = (BufHdr *)0x0;
  src->m_size = 0;
  return;
}

Assistant:

void
	move(BufRef&& src) {
		if (m_hdr)
			m_hdr->release();

		m_p = src.m_p;
		m_hdr = src.m_hdr;
		m_size = src.m_size;
		src.initialize();
	}